

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElDisc.cpp
# Opt level: O2

void __thiscall TPZCompElDisc::Print(TPZCompElDisc *this,ostream *out)

{
  int iVar1;
  TPZGeoEl *pTVar2;
  ostream *poVar3;
  int iVar4;
  ulong uVar5;
  TPZManVector<double,_3> xcenter;
  TPZManVector<double,_3> loccenter;
  
  std::operator<<(out,"\nDiscontinous element : \n");
  TPZCompEl::Print((TPZCompEl *)this,out);
  pTVar2 = TPZCompEl::Reference((TPZCompEl *)this);
  if (pTVar2 != (TPZGeoEl *)0x0) {
    poVar3 = std::operator<<(out,"\tGeometric reference index : ");
    TPZCompEl::Reference((TPZCompEl *)this);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  poVar3 = std::operator<<(out,"\tMaterial id : ");
  pTVar2 = TPZCompEl::Reference((TPZCompEl *)this);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pTVar2->fMatId);
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar3,"\tDegree of interpolation : ");
  iVar1 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x338))(this)
  ;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar3,"\tConnect index : ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar3,"\tUsing qsieta : ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->fUseQsiEta);
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<(poVar3,"\tNormalizing constant : ");
  poVar3 = std::ostream::_M_insert<double>(this->fConstC);
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<(poVar3,"\tCenter point of the element : ");
  if (this->fUseQsiEta == false) {
    iVar1 = (int)(this->fCenterPoint).super_TPZVec<double>.fNElements;
    iVar4 = 1;
    if (1 < iVar1) {
      iVar4 = iVar1;
    }
    for (uVar5 = 0; iVar4 - 1 != uVar5; uVar5 = uVar5 + 1) {
      poVar3 = std::ostream::_M_insert<double>
                         ((this->fCenterPoint).super_TPZVec<double>.fStore[uVar5]);
      std::operator<<(poVar3," , ");
    }
    std::operator<<(out,"stored xy : ");
    poVar3 = std::ostream::_M_insert<double>
                       ((this->fCenterPoint).super_TPZVec<double>.fStore[iVar4 - 1]);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    pTVar2 = TPZCompEl::Reference((TPZCompEl *)this);
    if (pTVar2 != (TPZGeoEl *)0x0) {
      TPZManVector<double,_3>::TPZManVector(&xcenter,3);
      TPZManVector<double,_3>::TPZManVector(&loccenter,&this->fCenterPoint);
      (**(code **)(*(long *)pTVar2 + 0x228))(pTVar2,&loccenter,&xcenter);
      poVar3 = std::operator<<(out,"stored qsieta ");
      poVar3 = ::operator<<(poVar3,&(this->fCenterPoint).super_TPZVec<double>);
      poVar3 = std::operator<<(poVar3," computed xy ");
      poVar3 = ::operator<<(poVar3,&xcenter.super_TPZVec<double>);
      std::endl<char,std::char_traits<char>>(poVar3);
      TPZManVector<double,_3>::~TPZManVector(&loccenter);
      TPZManVector<double,_3>::~TPZManVector(&xcenter);
    }
  }
  poVar3 = std::operator<<(out,"\tDimension : ");
  iVar1 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xb0))(this);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void TPZCompElDisc::Print(std::ostream &out) const{
	
	out << "\nDiscontinous element : \n";
	TPZCompEl::Print(out);
	if(Reference()) out << "\tGeometric reference index : " << Reference()->Index() << endl;
	out << "\tMaterial id : " << Reference()->MaterialId() << endl
	<< "\tDegree of interpolation : " <<  this->Degree() << endl
	<< "\tConnect index : " << fConnectIndex << endl
    << "\tUsing qsieta : " << (int)fUseQsiEta << endl
	<< "\tNormalizing constant : " << fConstC << endl
	<< "\tCenter point of the element : ";
    if(fUseQsiEta == false)
    {
        int size = fCenterPoint.NElements(),i;
        for(i=0;i<size-1;i++) out << fCenterPoint[i] << " , ";
        out << "stored xy : " << fCenterPoint[i] << endl;
    }
    else
    {
        TPZGeoEl *Ref = Reference();
        if (Ref) {
            TPZManVector<REAL,3> xcenter(3),loccenter(fCenterPoint);
            Ref->X(loccenter, xcenter);
            out << "stored qsieta " << fCenterPoint << " computed xy " << xcenter << std::endl;
        }
    }
	out << "\tDimension : " << this->Dimension() << endl;
}